

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_frameChunk
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 U32 lastFrameChunk)

{
  U32 maxDist_00;
  uint uVar1;
  U32 UVar2;
  uint uVar3;
  ZSTD_matchState_t *window;
  ZSTD_CCtx *code;
  ZSTD_CCtx *pZStack_90;
  U32 cBlockHeader24;
  size_t cSize;
  U32 correction;
  U32 cycleLog;
  U32 lastBlock;
  ZSTD_matchState_t *ms;
  byte *pbStack_68;
  U32 maxDist;
  BYTE *op;
  BYTE *ostart;
  BYTE *ip;
  size_t remaining;
  size_t blockSize;
  U32 lastFrameChunk_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  remaining = cctx->blockSize;
  maxDist_00 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
  pbStack_68 = (byte *)dst;
  ostart = (BYTE *)src;
  ip = (BYTE *)srcSize;
  src_local = (void *)dstCapacity;
  if (((cctx->appliedParams).fParams.checksumFlag != 0) && (srcSize != 0)) {
    XXH64_update(&cctx->xxhState,src,srcSize);
  }
  while( true ) {
    if (ip == (BYTE *)0x0) {
      if ((lastFrameChunk != 0) && (dst < pbStack_68)) {
        cctx->stage = ZSTDcs_ending;
      }
      return (size_t)(ZSTD_CCtx *)(pbStack_68 + -(long)dst);
    }
    window = &(cctx->blockState).matchState;
    uVar1 = lastFrameChunk & ip <= remaining;
    if (src_local < (void *)0x6) break;
    if (ip < remaining) {
      remaining = (size_t)ip;
    }
    UVar2 = ZSTD_window_needOverflowCorrection(window->window,ostart + remaining);
    if (UVar2 != 0) {
      UVar2 = ZSTD_cycleLog((cctx->appliedParams).cParams.chainLog,
                            (cctx->appliedParams).cParams.strategy);
      UVar2 = ZSTD_window_correctOverflow(&window->window,UVar2,maxDist_00,ostart);
      ZSTD_reduceIndex(cctx,UVar2);
      if ((cctx->blockState).matchState.nextToUpdate < UVar2) {
        (cctx->blockState).matchState.nextToUpdate = 0;
      }
      else {
        (cctx->blockState).matchState.nextToUpdate =
             (cctx->blockState).matchState.nextToUpdate - UVar2;
      }
      (cctx->blockState).matchState.loadedDictEnd = 0;
      (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
    }
    ZSTD_window_enforceMaxDist
              (&window->window,ostart + remaining,maxDist_00,
               &(cctx->blockState).matchState.loadedDictEnd,
               &(cctx->blockState).matchState.dictMatchState);
    if ((cctx->blockState).matchState.nextToUpdate < (cctx->blockState).matchState.window.lowLimit)
    {
      (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.lowLimit;
    }
    code = (ZSTD_CCtx *)
           ZSTD_compressBlock_internal(cctx,pbStack_68 + 3,(long)src_local - 3,ostart,remaining);
    uVar3 = ERR_isError((size_t)code);
    if (uVar3 != 0) {
      return (size_t)code;
    }
    if (code == (ZSTD_CCtx *)0x0) {
      pZStack_90 = (ZSTD_CCtx *)
                   ZSTD_noCompressBlock(pbStack_68,(size_t)src_local,ostart,remaining,uVar1);
      uVar1 = ERR_isError((size_t)pZStack_90);
      if (uVar1 != 0) {
        return (size_t)pZStack_90;
      }
    }
    else {
      MEM_writeLE24(pbStack_68,uVar1 + 4 + (int)((long)code << 3));
      pZStack_90 = (ZSTD_CCtx *)((long)&code->stage + 3);
    }
    ostart = ostart + remaining;
    ip = ip + -remaining;
    pbStack_68 = pbStack_68 + (long)&pZStack_90->stage;
    src_local = (void *)((long)src_local - (long)pZStack_90);
  }
  return (size_t)(ZSTD_CCtx *)0xffffffffffffffba;
}

Assistant:

static size_t ZSTD_compress_frameChunk (ZSTD_CCtx* cctx,
                                     void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                                     U32 lastFrameChunk)
{
    size_t blockSize = cctx->blockSize;
    size_t remaining = srcSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;
    U32 const maxDist = (U32)1 << cctx->appliedParams.cParams.windowLog;
    assert(cctx->appliedParams.cParams.windowLog <= 31);

    DEBUGLOG(5, "ZSTD_compress_frameChunk (blockSize=%u)", (unsigned)blockSize);
    if (cctx->appliedParams.fParams.checksumFlag && srcSize)
        XXH64_update(&cctx->xxhState, src, srcSize);

    while (remaining) {
        ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
        U32 const lastBlock = lastFrameChunk & (blockSize >= remaining);

        if (dstCapacity < ZSTD_blockHeaderSize + MIN_CBLOCK_SIZE)
            return ERROR(dstSize_tooSmall);   /* not enough space to store compressed block */
        if (remaining < blockSize) blockSize = remaining;

        if (ZSTD_window_needOverflowCorrection(ms->window, ip + blockSize)) {
            U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
            U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
            ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
            ZSTD_reduceIndex(cctx, correction);
            if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
            else ms->nextToUpdate -= correction;
            ms->loadedDictEnd = 0;
            ms->dictMatchState = NULL;
        }
        ZSTD_window_enforceMaxDist(&ms->window, ip + blockSize, maxDist, &ms->loadedDictEnd, &ms->dictMatchState);
        if (ms->nextToUpdate < ms->window.lowLimit) ms->nextToUpdate = ms->window.lowLimit;

        {   size_t cSize = ZSTD_compressBlock_internal(cctx,
                                op+ZSTD_blockHeaderSize, dstCapacity-ZSTD_blockHeaderSize,
                                ip, blockSize);
            if (ZSTD_isError(cSize)) return cSize;

            if (cSize == 0) {  /* block is not compressible */
                cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
                if (ZSTD_isError(cSize)) return cSize;
            } else {
                U32 const cBlockHeader24 = lastBlock + (((U32)bt_compressed)<<1) + (U32)(cSize << 3);
                MEM_writeLE24(op, cBlockHeader24);
                cSize += ZSTD_blockHeaderSize;
            }

            ip += blockSize;
            assert(remaining >= blockSize);
            remaining -= blockSize;
            op += cSize;
            assert(dstCapacity >= cSize);
            dstCapacity -= cSize;
            DEBUGLOG(5, "ZSTD_compress_frameChunk: adding a block of size %u",
                        (unsigned)cSize);
    }   }

    if (lastFrameChunk && (op>ostart)) cctx->stage = ZSTDcs_ending;
    return op-ostart;
}